

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencc.c
# Opt level: O3

char * opencc_convert_utf8(opencc_t t_opencc,char *inbuf,size_t length)

{
  size_t sVar1;
  ucs4_t *str;
  char *pcVar2;
  ucs4_t *ucs4;
  size_t sVar3;
  char *__s;
  long lVar4;
  char *__dest;
  ulong uVar5;
  ucs4_t *poutbuf;
  size_t outbuf_left;
  size_t inbuf_left;
  ucs4_t *pinbuf;
  ucs4_t *local_68;
  ucs4_t *local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  opencc_t local_40;
  ucs4_t *local_38;
  
  if (lib_initialized == '\0') {
    lib_initialized = '\x01';
  }
  local_40 = t_opencc;
  if ((length == 0xffffffffffffffff) || (sVar1 = strlen(inbuf), sVar1 < length)) {
    length = strlen(inbuf);
  }
  str = utf8_to_ucs4(inbuf,length);
  if (str == (ucs4_t *)0xffffffffffffffff) {
LAB_00104d6c:
    errnum = OPENCC_ERROR_ENCODIND;
LAB_00104d76:
    pcVar2 = (char *)0xffffffffffffffff;
  }
  else {
    pcVar2 = (char *)malloc(length + 1);
    *pcVar2 = '\0';
    ucs4 = (ucs4_t *)malloc(length * 4 + 0x104);
    local_68 = ucs4;
    local_38 = str;
    local_50 = ucs4len(str);
    local_58 = length + 0x40;
    __dest = pcVar2;
    uVar5 = length;
    while (local_48 = local_58, local_50 != 0) {
      if (lib_initialized == '\0') {
        lib_initialized = '\x01';
      }
      local_60 = ucs4;
      sVar3 = converter_convert(*(converter_t *)((long)local_40 + 8),&local_38,&local_50,&local_68,
                                &local_58);
      if (sVar3 == 0xffffffffffffffff) {
        errnum = OPENCC_ERROR_CONVERTER;
        free(__dest);
        free(str);
        free(ucs4);
        goto LAB_00104d76;
      }
      *local_68 = 0;
      __s = ucs4_to_utf8(ucs4,0xffffffffffffffff);
      if (__s == (char *)0xffffffffffffffff) {
        free(__dest);
        free(str);
        free(local_60);
        goto LAB_00104d6c;
      }
      sVar1 = strlen(__s);
      while (uVar5 < sVar1) {
        lVar4 = (long)__dest - (long)pcVar2;
        pcVar2 = (char *)realloc(pcVar2,length * 2);
        __dest = pcVar2 + lVar4;
        uVar5 = uVar5 + length;
        length = length * 2;
      }
      strncpy(__dest,__s,sVar1);
      free(__s);
      __dest[sVar1] = '\0';
      local_58 = local_48;
      __dest = __dest + sVar1;
      ucs4 = local_60;
      local_68 = local_60;
    }
    free(str);
    free(ucs4);
    sVar1 = strlen(pcVar2);
    pcVar2 = (char *)realloc(pcVar2,sVar1 + 1);
  }
  return pcVar2;
}

Assistant:

char * opencc_convert_utf8(opencc_t t_opencc, const char * inbuf, size_t length)
{
	if (!lib_initialized)
		lib_initialize();

	if (length == (size_t) -1 || length > strlen(inbuf))
		length = strlen(inbuf);

	/* 將輸入數據轉換爲ucs4_t字符串 */
	ucs4_t * winbuf = utf8_to_ucs4(inbuf, length);
	if (winbuf == (ucs4_t *) -1)
	{
		/* 輸入數據轉換失敗 */
		errnum = OPENCC_ERROR_ENCODIND;
		return (char *) -1;
	}

	/* 設置輸出UTF8文本緩衝區空間 */
	size_t outbuf_len = length;
	size_t outsize = outbuf_len;
	char * original_outbuf = (char *) malloc(sizeof(char) * (outbuf_len + 1));
	char * outbuf = original_outbuf;
	original_outbuf[0] = '\0';

	/* 設置轉換緩衝區空間 */
	size_t wbufsize = length + 64;
	ucs4_t * woutbuf = (ucs4_t *) malloc(sizeof(ucs4_t) * (wbufsize + 1));

	ucs4_t * pinbuf = winbuf;
	ucs4_t * poutbuf = woutbuf;
	size_t inbuf_left, outbuf_left;

	inbuf_left = ucs4len(winbuf);
	outbuf_left = wbufsize;

	while (inbuf_left > 0)
	{
		size_t retval = opencc_convert(t_opencc, &pinbuf, &inbuf_left, &poutbuf, &outbuf_left);
		if (retval == (size_t) -1)
		{
			free(outbuf);
			free(winbuf);
			free(woutbuf);
			return (char *) -1;
		}

		*poutbuf = L'\0';

		char * ubuff = ucs4_to_utf8(woutbuf, (size_t) -1);

		if (ubuff == (char *) -1)
		{
			free(outbuf);
			free(winbuf);
			free(woutbuf);
			errnum = OPENCC_ERROR_ENCODIND;
			return (char *) -1;
		}

		size_t ubuff_len = strlen(ubuff);

		while (ubuff_len > outsize)
		{
			size_t outbuf_offset = outbuf - original_outbuf;
			outsize += outbuf_len;
			outbuf_len += outbuf_len;
			original_outbuf = (char *) realloc(original_outbuf, sizeof(char) * outbuf_len);
			outbuf = original_outbuf + outbuf_offset;
		}

		strncpy(outbuf, ubuff, ubuff_len);
		free(ubuff);

		outbuf += ubuff_len;
		*outbuf = '\0';

		outbuf_left = wbufsize;
		poutbuf = woutbuf;
	}

	free(winbuf);
	free(woutbuf);

	original_outbuf = (char *) realloc(original_outbuf,
			sizeof(char) * (strlen(original_outbuf) + 1));

	return original_outbuf;
}